

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O0

void Assimp::IFC::ConvertAxisPlacement(IfcMatrix4 *out,IfcAxis2Placement3D *in)

{
  bool bVar1;
  IfcCartesianPoint *in_00;
  Lazy<Assimp::IFC::Schema_2x3::IfcDirection> *pLVar2;
  IfcDirection *pIVar3;
  aiVector3t<double> *paVar4;
  double f;
  undefined1 local_d8 [8];
  IfcVector3 y;
  undefined1 local_a8 [8];
  IfcVector3 tmpx;
  IfcVector3 v;
  IfcVector3 x;
  IfcVector3 r;
  IfcVector3 z;
  IfcVector3 loc;
  IfcAxis2Placement3D *in_local;
  IfcMatrix4 *out_local;
  
  aiVector3t<double>::aiVector3t((aiVector3t<double> *)&z.z);
  in_00 = STEP::Lazy::operator_cast_to_IfcCartesianPoint_
                    ((Lazy *)&(in->super_IfcPlacement).super_IfcGeometricRepresentationItem.
                              field_0x30);
  ConvertCartesianPoint((IfcVector3 *)&z.z,in_00);
  aiVector3t<double>::aiVector3t((aiVector3t<double> *)&r.z,0.0,0.0,1.0);
  aiVector3t<double>::aiVector3t((aiVector3t<double> *)&x.z,1.0,0.0,0.0);
  aiVector3t<double>::aiVector3t((aiVector3t<double> *)&v.z);
  bVar1 = STEP::Maybe::operator_cast_to_bool((Maybe *)&(in->super_IfcPlacement).field_0x48);
  if (bVar1) {
    pLVar2 = STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_>::Get
                       ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_> *)
                        &(in->super_IfcPlacement).field_0x48);
    pIVar3 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>::operator*(pLVar2);
    ConvertDirection((IfcVector3 *)&r.z,pIVar3);
  }
  bVar1 = STEP::Maybe::operator_cast_to_bool((Maybe *)&in->RefDirection);
  if (bVar1) {
    pLVar2 = STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_>::Get
                       (&in->RefDirection);
    pIVar3 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>::operator*(pLVar2);
    ConvertDirection((IfcVector3 *)&x.z,pIVar3);
  }
  paVar4 = aiVector3t<double>::Normalize((aiVector3t<double> *)&x.z);
  tmpx.z = paVar4->x;
  v.x = paVar4->y;
  v.y = paVar4->z;
  f = ::operator*((aiVector3t<double> *)&tmpx.z,(aiVector3t<double> *)&r.z);
  ::operator*((aiVector3t<double> *)local_a8,(aiVector3t<double> *)&r.z,f);
  ::operator-((aiVector3t<double> *)&y.z,(aiVector3t<double> *)&tmpx.z,
              (aiVector3t<double> *)local_a8);
  paVar4 = aiVector3t<double>::Normalize((aiVector3t<double> *)&y.z);
  v.z = paVar4->x;
  x.x = paVar4->y;
  x.y = paVar4->z;
  operator^((aiVector3t<double> *)local_d8,(aiVector3t<double> *)&r.z,(aiVector3t<double> *)&v.z);
  aiMatrix4x4t<double>::Translation((aiVector3t<double> *)&z.z,out);
  AssignMatrixAxes(out,(IfcVector3 *)&v.z,(IfcVector3 *)local_d8,(IfcVector3 *)&r.z);
  return;
}

Assistant:

void ConvertAxisPlacement(IfcMatrix4& out, const Schema_2x3::IfcAxis2Placement3D& in)
{
    IfcVector3 loc;
    ConvertCartesianPoint(loc,in.Location);

    IfcVector3 z(0.f,0.f,1.f),r(1.f,0.f,0.f),x;

    if (in.Axis) {
        ConvertDirection(z,*in.Axis.Get());
    }
    if (in.RefDirection) {
        ConvertDirection(r,*in.RefDirection.Get());
    }

    IfcVector3 v = r.Normalize();
    IfcVector3 tmpx = z * (v*z);

    x = (v-tmpx).Normalize();
    IfcVector3 y = (z^x);

    IfcMatrix4::Translation(loc,out);
    AssignMatrixAxes(out,x,y,z);
}